

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

void ParseDecorate(FScanner *sc)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  SavedPos SVar4;
  undefined1 local_128 [8];
  FScanner newscanner;
  undefined1 auStack_20 [4];
  int includefile;
  SavedPos pos;
  FScanner *sc_local;
  
  pos._8_8_ = sc;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          SVar4 = FScanner::SavePos((FScanner *)pos._8_8_);
          _auStack_20 = SVar4.SavedScriptPtr;
          pos.SavedScriptPtr._0_4_ = SVar4.SavedScriptLine;
          bVar1 = FScanner::GetToken((FScanner *)pos._8_8_);
          if (!bVar1) {
            return;
          }
          iVar2 = *(int *)(pos._8_8_ + 0xc);
          if (iVar2 != 0x3b) break;
          FScanner::ScriptError((FScanner *)pos._8_8_,"Unexpected \';\'");
        }
        if (iVar2 != 0x101) break;
        bVar1 = FScanner::Compare((FScanner *)pos._8_8_,"ACTOR");
        if (bVar1) {
          ParseActor((FScanner *)pos._8_8_);
        }
        else {
          bVar1 = FScanner::Compare((FScanner *)pos._8_8_,"PICKUP");
          if (bVar1) {
            ParseOldDecoration((FScanner *)pos._8_8_,DEF_Pickup);
          }
          else {
            bVar1 = FScanner::Compare((FScanner *)pos._8_8_,"BREAKABLE");
            if (bVar1) {
              ParseOldDecoration((FScanner *)pos._8_8_,DEF_BreakableDecoration);
            }
            else {
              bVar1 = FScanner::Compare((FScanner *)pos._8_8_,"PROJECTILE");
              if (bVar1) {
                ParseOldDecoration((FScanner *)pos._8_8_,DEF_Projectile);
              }
              else {
                bVar1 = FScanner::Compare((FScanner *)pos._8_8_,"DAMAGETYPE");
                if (!bVar1) goto LAB_008dacdb;
                ParseDamageDefinition((FScanner *)pos._8_8_);
              }
            }
          }
        }
      }
      if (iVar2 == 0x127) break;
      if (iVar2 == 0x142) {
        ParseEnum((FScanner *)pos._8_8_,&GlobalSymbols,(PClassActor *)0x0);
      }
      else if (iVar2 == 0x171) {
        FScanner::MustGetString((FScanner *)pos._8_8_);
        iVar2 = FWadCollection::GetLumpFile(&Wads,*(int *)(pos._8_8_ + 0x2c));
        if ((iVar2 == 0) &&
           (iVar2 = DArgs::CheckParm(Args,"-allowdecoratecrossincludes",1), iVar2 == 0)) {
          iVar2 = FWadCollection::CheckNumForFullName(&Wads,*(char **)pos._8_8_,true,0);
          newscanner._252_4_ = FWadCollection::GetLumpFile(&Wads,iVar2);
          if (newscanner._252_4_ != 0) {
            pcVar3 = FWadCollection::GetWadFullName(&Wads,newscanner._252_4_);
            I_FatalError("File %s is overriding core lump %s.",pcVar3,*(undefined8 *)pos._8_8_);
          }
        }
        FScanner::FScanner((FScanner *)local_128);
        FScanner::Open((FScanner *)local_128,*(char **)pos._8_8_);
        ParseDecorate((FScanner *)local_128);
        FScanner::~FScanner((FScanner *)local_128);
      }
      else {
LAB_008dacdb:
        FScanner::RestorePos((FScanner *)pos._8_8_,(SavedPos *)auStack_20);
        ParseOldDecoration((FScanner *)pos._8_8_,DEF_Decoration);
      }
    }
    ParseConstant((FScanner *)pos._8_8_,&GlobalSymbols,(PClassActor *)0x0);
  } while( true );
}

Assistant:

void ParseDecorate (FScanner &sc)
{
	// Get actor class name.
	for(;;)
	{
		FScanner::SavedPos pos = sc.SavePos();
		if (!sc.GetToken ())
		{
			return;
		}
		switch (sc.TokenType)
		{
		case TK_Include:
		{
			sc.MustGetString();
			// This check needs to remain overridable for testing purposes.
			if (Wads.GetLumpFile(sc.LumpNum) == 0 && !Args->CheckParm("-allowdecoratecrossincludes"))
			{
				int includefile = Wads.GetLumpFile(Wads.CheckNumForFullName(sc.String, true));
				if (includefile != 0)
				{
					I_FatalError("File %s is overriding core lump %s.",
						Wads.GetWadFullName(includefile), sc.String);
				}
			}
			FScanner newscanner;
			newscanner.Open(sc.String);
			ParseDecorate(newscanner);
			break;
		}

		case TK_Const:
			ParseConstant (sc, &GlobalSymbols, NULL);
			break;

		case TK_Enum:
			ParseEnum (sc, &GlobalSymbols, NULL);
			break;

		case ';':
			// ';' is the start of a comment in the non-cmode parser which
			// is used to parse parts of the DECORATE lump. If we don't add 
			// a check here the user will only get weird non-informative
			// error messages if a semicolon is found.
			sc.ScriptError("Unexpected ';'");
			break;

		case TK_Identifier:
			// 'ACTOR' cannot be a keyword because it is also needed as a class identifier
			// so let's do a special case for this.
			if (sc.Compare("ACTOR"))
			{
				ParseActor (sc);
				break;
			}
			else if (sc.Compare("PICKUP"))
			{
				ParseOldDecoration (sc, DEF_Pickup);
				break;
			}
			else if (sc.Compare("BREAKABLE"))
			{
				ParseOldDecoration (sc, DEF_BreakableDecoration);
				break;
			}
			else if (sc.Compare("PROJECTILE"))
			{
				ParseOldDecoration (sc, DEF_Projectile);
				break;
			}
			else if (sc.Compare("DAMAGETYPE"))
			{
				ParseDamageDefinition(sc);
				break;
			}
		default:
			sc.RestorePos(pos);
			ParseOldDecoration(sc, DEF_Decoration);
			break;
		}
	}
}